

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

JSONNode __thiscall JSONNode::pop_back(JSONNode *this,json_string *name_t)

{
  long lVar1;
  uchar uVar2;
  json_string *__lhs;
  out_of_range *this_00;
  string *psVar3;
  json_string *in_RDX;
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  auto_delete local_88;
  auto_delete temp;
  JSONNode *res;
  allocator local_41;
  json_string local_40;
  json_string *local_20;
  json_string *name_t_local;
  JSONNode *this_local;
  
  lVar1 = *(long *)name_t;
  local_20 = in_RDX;
  name_t_local = name_t;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"no internal",&local_41);
  JSONDebug::_JSON_ASSERT(lVar1 != 0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  uVar2 = type((JSONNode *)name_t);
  __lhs = jsonSingletonERROR_NON_ITERATABLE::getValue_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,__lhs,
                 "pop_back");
  JSONDebug::_JSON_ASSERT(uVar2 == '\x05',(json_string *)&res);
  std::__cxx11::string::~string((string *)&res);
  temp.mynode = internalJSONNode::pop_back(*(internalJSONNode **)name_t,local_20);
  if (temp.mynode != (JSONNode *)0x0) {
    auto_delete::auto_delete(&local_88,temp.mynode);
    JSONNode(this,local_88.mynode);
    auto_delete::~auto_delete(&local_88);
    return (JSONNode)(internalJSONNode *)this;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c8,"pop_back const could not find child by name: ",&local_c9);
  std::operator+(&local_a8,&local_c8,local_20);
  JSONDebug::_JSON_FAIL(&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  psVar3 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::out_of_range::out_of_range(this_00,(string *)psVar3);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

json_throws(std::out_of_range) {
    JSON_CHECK_INTERNAL();
    JSON_ASSERT(type() == JSON_NODE, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("pop_back"));
    #ifdef JSON_LIBRARY
	   return internal -> pop_back(name_t);
    #else
	   if (JSONNode * res = internal -> pop_back(name_t)){
		  auto_delete temp(res);
		  return *(temp.mynode);
	   }
	   JSON_FAIL(json_string(JSON_TEXT("pop_back const could not find child by name: ")) + name_t);
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    #endif
}